

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

int Wlc_PrsFindDefinition(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pXValue)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  undefined8 in_RAX;
  long lVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  byte *pbVar10;
  int iVar11;
  bool bVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  bool bVar17;
  int Beg;
  int End;
  undefined8 local_38;
  
  vFanins->nSize = 0;
  do {
    bVar3 = *pStr;
    pStr = (char *)((byte *)pStr + 1);
  } while (bVar3 == 0x20);
  if (bVar3 != 0x3d) {
    return 0;
  }
  do {
    pbVar14 = (byte *)pStr;
    pStr = (char *)(pbVar14 + 1);
  } while (*pbVar14 == 0x20);
  local_38 = in_RAX;
  if (*pbVar14 == 0x28) {
    pbVar10 = pbVar14 + -1;
    pbVar15 = (byte *)pStr;
    do {
      pbVar13 = pbVar15;
      if (*pbVar13 == 0) goto LAB_003766d7;
      pbVar15 = pbVar13 + 1;
    } while ((*pbVar13 != 0x3e) || (pbVar13[-1] != 0x3e));
    do {
      pbVar15 = (byte *)pStr;
      if (*pbVar15 == 0) goto LAB_003766d7;
      pStr = (char *)(pbVar15 + 1);
    } while ((*pbVar15 != 0x3c) || (pbVar15[-1] != 0x3c));
    bVar17 = true;
    iVar8 = 0;
    bVar3 = 0x28;
    pbVar15 = pbVar14;
    do {
      if ((bVar17) && (iVar8 = (iVar8 + (uint)(bVar3 == 0x28)) - (uint)(bVar3 == 0x29), iVar8 == 0))
      goto LAB_003767e4;
      bVar16 = bVar3 != 0x5c;
      bVar12 = bVar3 == 0x20;
      if (!bVar16) {
        bVar12 = bVar16;
      }
      if (bVar17) {
        bVar12 = bVar16;
      }
      bVar17 = bVar12;
      bVar3 = pbVar15[1];
      pbVar15 = pbVar15 + 1;
    } while (bVar3 != 0);
    pbVar15 = (byte *)0x0;
LAB_003767e4:
    if (pbVar15 == (byte *)0x0) {
      iVar8 = 0;
      Wlc_PrsWriteErrorMessage(p,(char *)pbVar14,"Expecting closing parenthesis.");
    }
    else {
      *pbVar14 = 0x20;
      *pbVar15 = 0;
      do {
        pbVar14 = pbVar10 + 1;
        pbVar10 = pbVar10 + 1;
      } while (*pbVar14 == 0x20);
      iVar8 = 1;
      pbVar14 = pbVar10;
    }
    if (pbVar15 == (byte *)0x0) {
      return 0;
    }
  }
  else {
    iVar8 = 0;
  }
LAB_0037682e:
  bVar3 = *pbVar14;
  if (0xf5 < (byte)(bVar3 - 0x3a)) {
    pbVar14 = (byte *)Wlc_PrsReadConstant(p,(char *)pbVar14,vFanins,(int *)((long)&local_38 + 4),
                                          (int *)&local_38,pXValue);
    iVar11 = 6;
    if (pbVar14 == (byte *)0x0) {
      return 0;
    }
    goto LAB_00376bf0;
  }
  lVar4 = 1;
  iVar11 = 0x32;
  if (bVar3 < 0x40) {
    if (0x25 < bVar3) {
      if (bVar3 != 0x26) {
        if (bVar3 != 0x2d) goto LAB_00376929;
        goto LAB_00376b04;
      }
LAB_00376aff:
      iVar11 = 0x25;
      goto LAB_00376b04;
    }
    iVar2 = 0x1a;
    if (bVar3 != 0x21) {
      if (bVar3 != 0x23) goto LAB_00376929;
      iVar2 = 0x34;
    }
LAB_00376b4d:
    do {
      iVar11 = iVar2;
      pbVar10 = pbVar14 + 1;
      pbVar14 = pbVar14 + 1;
      iVar2 = iVar11;
    } while (*pbVar10 == 0x20);
    if (*pbVar10 == 0x28) {
      bVar17 = true;
      iVar8 = 0;
      bVar3 = 0x28;
      pbVar10 = pbVar14;
      do {
        if ((bVar17) &&
           (iVar8 = (iVar8 + (uint)(bVar3 == 0x28)) - (uint)(bVar3 == 0x29), iVar8 == 0))
        goto LAB_00376ba8;
        bVar16 = bVar3 != 0x5c;
        bVar12 = bVar3 == 0x20;
        if (!bVar16) {
          bVar12 = bVar16;
        }
        if (bVar17) {
          bVar12 = bVar16;
        }
        bVar17 = bVar12;
        bVar3 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
      } while (bVar3 != 0);
      pbVar10 = (byte *)0x0;
LAB_00376ba8:
      if (pbVar10 == (byte *)0x0) {
        Wlc_PrsWriteErrorMessage(p,(char *)pbVar14,"Expecting closing parenthesis.");
        return 0;
      }
      *pbVar10 = 0x20;
      *pbVar14 = 0x20;
    }
    pbVar14 = (byte *)Wlc_PrsReadName(p,(char *)pbVar14,vFanins);
    if (pbVar14 != (byte *)0x0) goto LAB_00376bf0;
    pcVar5 = "Cannot read name after !.";
LAB_00376cef:
    pbVar14 = (byte *)0x0;
LAB_00376cf7:
    Wlc_PrsWriteErrorMessage(p,(char *)pbVar14,pcVar5);
    return 0;
  }
  if (bVar3 < 0x7c) {
    if (bVar3 == 0x40) {
      iVar2 = 0x33;
      goto LAB_00376b4d;
    }
    if (bVar3 != 0x5e) goto LAB_00376929;
LAB_003768c1:
    iVar11 = 0x27;
LAB_00376b04:
    pbVar14 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar14 + lVar4),vFanins);
    if (pbVar14 == (byte *)0x0) {
      pcVar5 = "Cannot read name after a unary operator.";
      goto LAB_00376cef;
    }
  }
  else {
    if (bVar3 == 0x7c) {
LAB_0037696f:
      iVar11 = 0x26;
      goto LAB_00376b04;
    }
    if (bVar3 == 0x7e) {
      bVar7 = pbVar14[1];
      if (((bVar7 != 0x26) && (bVar7 != 0x7c)) && (bVar7 != 0x5e)) {
        iVar2 = 0xf;
        goto LAB_00376b4d;
      }
      if (pbVar14[1] != 0x26) goto LAB_00376929;
LAB_00376935:
      if (bVar3 < 0x5e) {
        if (bVar3 == 0x26) goto LAB_00376aff;
        if (bVar3 != 0x2d) {
LAB_00376ab9:
          if (bVar3 != 0x7e) {
LAB_00376ae0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                          ,0x2f4,
                          "int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)");
          }
          lVar4 = 2;
          iVar11 = 0x29;
          if ((pbVar14[1] != 0x7c) && (iVar11 = 0x2a, pbVar14[1] != 0x5e)) goto LAB_00376ae0;
        }
      }
      else {
        if (bVar3 == 0x5e) goto LAB_003768c1;
        if (bVar3 == 0x7c) goto LAB_0037696f;
        if ((bVar3 != 0x7e) || (pbVar14[1] != 0x26)) goto LAB_00376ab9;
        lVar4 = 2;
        iVar11 = 0x28;
      }
      goto LAB_00376b04;
    }
LAB_00376929:
    if ((bVar3 == 0x7e) && ((pbVar14[1] == 0x7c || (pbVar14[1] == 0x5e)))) goto LAB_00376935;
    if (bVar3 == 0x7b) {
      bVar3 = pbVar14[1];
      if (bVar3 != 0) {
        pbVar10 = pbVar14 + 2;
        bVar17 = true;
        bVar7 = bVar3;
        do {
          if ((bool)(bVar17 & bVar7 == 0x7b)) {
            iVar11 = 0x19;
            if (bVar3 == 0) goto LAB_00376ee6;
            pbVar10 = pbVar14 + 2;
            bVar17 = true;
            bVar7 = bVar3;
            goto LAB_00376d26;
          }
          bVar16 = bVar7 != 0x5c;
          bVar12 = bVar7 == 0x20;
          if (!bVar16) {
            bVar12 = bVar16;
          }
          if (bVar17) {
            bVar12 = bVar16;
          }
          bVar17 = bVar12;
          bVar7 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar7 != 0);
      }
      do {
        do {
          pbVar10 = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
        } while (*pbVar10 == 0x20);
        pbVar14 = (byte *)Wlc_PrsReadName(p,(char *)pbVar14,vFanins);
        if (pbVar14 == (byte *)0x0) {
          pcVar5 = "Cannot read name in concatenation.";
          goto LAB_00376cef;
        }
      } while (*pbVar14 == 0x2c);
      if (*pbVar14 != 0x7d) {
        pcVar5 = "Expected comma (,) in this place.";
        goto LAB_00376cf7;
      }
      iVar11 = 0x17;
LAB_00376f4b:
      if (*pbVar14 != 0x7d) {
        __assert_fail("pStr[0] == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                      ,0x318,"int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)");
      }
      pbVar14 = pbVar14 + 1;
    }
    else {
      pbVar10 = (byte *)Wlc_PrsReadName(p,(char *)pbVar14,vFanins);
      if (pbVar10 == (byte *)0x0) {
        return 0;
      }
      bVar3 = *pbVar10;
      if (bVar3 < 0x3f) {
        if (bVar3 != 0) {
          if (((bVar3 != 0x3e) || (pbVar10[1] != 0x3e)) || (pbVar10[2] == 0x3e)) goto LAB_00376df2;
          pbVar10 = pbVar10 + 2;
          iVar11 = iVar8 * 4 + 9;
          goto LAB_0037719d;
        }
        iVar11 = 7;
        pbVar14 = pbVar10;
      }
      else if (bVar3 == 0x5b) {
        pbVar14 = (byte *)Wlc_PrsFindRange((char *)pbVar10,(int *)((long)&local_38 + 4),
                                           (int *)&local_38);
        if (pbVar14 == (byte *)0x0) {
          Wlc_PrsWriteErrorMessage(p,(char *)pbVar10,"Non-standard range.");
          return 0;
        }
        Vec_IntPush(vFanins,local_38._4_4_);
        Vec_IntPush(vFanins,(int)local_38);
        iVar11 = 0x16;
      }
      else {
        if (bVar3 == 0x3f) {
          pbVar14 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar10 + 1),vFanins);
          if (pbVar14 != (byte *)0x0) {
            if (*pbVar14 != 0x3a) {
              pcVar5 = "MUX lacks the colon symbol (:).";
              goto LAB_00376cf7;
            }
            pbVar14 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar14 + 1),vFanins);
            if (pbVar14 != (byte *)0x0) {
              if (vFanins->nSize != 3) {
                __assert_fail("Vec_IntSize(vFanins) == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                              ,0x32a,
                              "int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)");
              }
              piVar1 = vFanins->pArray;
              iVar8 = piVar1[1];
              piVar1[1] = piVar1[2];
              piVar1[2] = iVar8;
              iVar11 = 8;
              goto LAB_00376bf0;
            }
          }
          pcVar5 = "Cannot read name in MUX.";
          goto LAB_00376cef;
        }
LAB_00376df2:
        if (((bVar3 == 0x3e) && (pbVar10[1] == 0x3e)) && (pbVar10[2] == 0x3e)) {
          pbVar10 = pbVar10 + 3;
          iVar11 = 10;
        }
        else if (bVar3 == 0x3c) {
          if ((pbVar10[1] == 0x3c) && (pbVar10[2] != 0x3c)) {
            pbVar10 = pbVar10 + 2;
            iVar11 = iVar8 * 3 + 0xb;
          }
          else {
            if ((pbVar10[1] != 0x3c) || (pbVar10[2] != 0x3c)) goto LAB_00376e48;
            pbVar10 = pbVar10 + 3;
            iVar11 = 0xc;
          }
        }
        else {
LAB_00376e48:
          if ((bVar3 == 0x26) && (pbVar10[1] != 0x26)) {
            pbVar10 = pbVar10 + 1;
            iVar11 = 0x10;
          }
          else if ((bVar3 == 0x7c) && (pbVar10[1] != 0x7c)) {
            pbVar10 = pbVar10 + 1;
            iVar11 = 0x11;
          }
          else if ((bVar3 == 0x5e) && (pbVar10[1] != 0x5e)) {
            pbVar10 = pbVar10 + 1;
            iVar11 = 0x12;
          }
          else if (bVar3 == 0x7e) {
            if (pbVar10[1] == 0x26) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x13;
            }
            else if (pbVar10[1] == 0x7c) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x14;
            }
            else {
              if (pbVar10[1] != 0x5e) goto LAB_0037703c;
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x15;
            }
          }
          else {
LAB_0037703c:
            if ((bVar3 == 0x3d) && (pbVar10[1] == 0x3e)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x1b;
            }
            else if ((bVar3 == 0x26) && (pbVar10[1] == 0x26)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x1c;
            }
            else if ((bVar3 == 0x7c) && (pbVar10[1] == 0x7c)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x1d;
            }
            else if ((bVar3 == 0x5e) && (pbVar10[1] == 0x5e)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x1e;
            }
            else if ((bVar3 == 0x3d) && (pbVar10[1] == 0x3d)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x1f;
            }
            else if ((bVar3 == 0x21) && (pbVar10[1] == 0x3d)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x20;
            }
            else if ((bVar3 == 0x3c) && (pbVar10[1] != 0x3d)) {
              pbVar10 = pbVar10 + 1;
              iVar11 = 0x21;
            }
            else if ((bVar3 == 0x3e) && (pbVar10[1] != 0x3d)) {
              pbVar10 = pbVar10 + 1;
              iVar11 = 0x22;
            }
            else if ((bVar3 == 0x3c) && (pbVar10[1] == 0x3d)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x23;
            }
            else if ((bVar3 == 0x3e) && (pbVar10[1] == 0x3d)) {
              pbVar10 = pbVar10 + 2;
              iVar11 = 0x24;
            }
            else {
              switch(bVar3) {
              case 0x25:
switchD_00377137_caseD_25:
                pbVar10 = pbVar10 + 1;
                iVar11 = 0x2f;
                break;
              default:
                goto switchD_00377137_caseD_26;
              case 0x2a:
                if (pbVar10[1] == 0x2a) {
                  if (bVar3 == 0x25) goto switchD_00377137_caseD_25;
                  if (bVar3 != 0x2a) {
                    if (bVar3 != 0x2f) goto switchD_00377137_caseD_26;
                    goto switchD_00377137_caseD_2f;
                  }
                  if (pbVar10[1] != 0x2a) {
switchD_00377137_caseD_26:
                    Wlc_PrsWriteErrorMessage
                              (p,(char *)pbVar10,"Unsupported operation (%c).",
                               (ulong)(uint)(int)(char)bVar3);
                    return 0;
                  }
                  pbVar10 = pbVar10 + 2;
                  iVar11 = 0x31;
                }
                else {
                  pbVar10 = pbVar10 + 1;
                  iVar11 = 0x2d;
                }
                break;
              case 0x2b:
                pbVar10 = pbVar10 + 1;
                iVar11 = 0x2b;
                break;
              case 0x2d:
                pbVar10 = pbVar10 + 1;
                iVar11 = 0x2c;
                break;
              case 0x2f:
switchD_00377137_caseD_2f:
                pbVar10 = pbVar10 + 1;
                iVar11 = 0x2e;
              }
            }
          }
        }
LAB_0037719d:
        pbVar10 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar10 + 1),vFanins);
        if (pbVar10 == (byte *)0x0) {
          return 0;
        }
        do {
          pbVar14 = pbVar10;
          pbVar10 = pbVar14 + 1;
        } while (*pbVar14 == 0x20);
        if ((iVar11 == 0x2b) && (*pbVar14 == 0x2b)) {
          pcVar5 = Wlc_PrsReadName(p,(char *)(pbVar14 + 1),vFanins);
          if (pcVar5 == (char *)0x0) {
            return 0;
          }
          pbVar10 = (byte *)(pcVar5 + -1);
          do {
            pbVar14 = pbVar10 + 1;
            pbVar15 = pbVar10 + 1;
            pbVar10 = pbVar14;
          } while (*pbVar15 == 0x20);
        }
        if (*pbVar14 != 0) {
          lVar4 = (long)p->vLines->nSize;
          uVar9 = 0xffffffff;
          if (0 < lVar4) {
            lVar6 = 0;
            do {
              if ((long)pbVar14 - (long)p->pBuffer < (long)p->vLines->pArray[lVar6]) {
                uVar9 = (ulong)((int)lVar6 + 1);
                break;
              }
              lVar6 = lVar6 + 1;
            } while (lVar4 != lVar6);
          }
          printf("Warning: Trailing symbols \"%s\" in line %d.\n",pbVar14,uVar9);
        }
      }
    }
  }
LAB_00376bf0:
  pbVar14 = pbVar14 + -1;
  do {
    bVar3 = pbVar14[1];
    pbVar14 = pbVar14 + 1;
  } while (bVar3 == 0x20);
  if (((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
    if (bVar3 != 0) goto LAB_00376c46;
    pcVar5 = Wlc_PrsFindName::Buffer;
    pbVar10 = pbVar14;
  }
  else {
    pbVar10 = (byte *)0x0;
    if ((0x3b < bVar3 - 0x24) || ((0x900000000000001U >> ((ulong)(bVar3 - 0x24) & 0x3f) & 1) == 0))
    goto LAB_00376cc6;
LAB_00376c46:
    pcVar5 = Wlc_PrsFindName::Buffer;
    bVar17 = true;
    iVar8 = 0;
    do {
      if (((bVar17) && (9 < (byte)(bVar3 - 0x30))) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
        if (bVar3 != 0x24) {
          if (bVar3 == 0x5c) goto LAB_00376c88;
          pbVar10 = pbVar14;
          if (bVar3 != 0x5f) break;
        }
LAB_00376c8e:
        bVar12 = !bVar17;
        bVar17 = true;
        if ((bVar12) && (bVar17 = false, bVar3 == 0x20)) {
          iVar8 = iVar8 + -1;
          bVar17 = iVar8 == 0;
        }
      }
      else {
        if (bVar3 != 0x5c) goto LAB_00376c8e;
LAB_00376c88:
        iVar8 = iVar8 + 1;
        bVar17 = false;
      }
      *pcVar5 = bVar3;
      pcVar5 = (char *)((byte *)pcVar5 + 1);
      bVar3 = pbVar14[1];
      pbVar14 = pbVar14 + 1;
      pbVar10 = pbVar14;
    } while (bVar3 != 0);
  }
  *pcVar5 = 0;
LAB_00376cc6:
  if (pbVar10 != (byte *)0x0) {
    iVar11 = 0;
    Wlc_PrsWriteErrorMessage
              (p,(char *)pbVar10,"Name %s is left at the end of the line.",Wlc_PrsFindName::Buffer);
  }
  return iVar11;
LAB_003766d7:
  bVar17 = true;
  iVar8 = 0;
  bVar3 = 0x28;
  pbVar15 = pbVar14;
  do {
    if ((bVar17) && (iVar8 = (iVar8 + (uint)(bVar3 == 0x28)) - (uint)(bVar3 == 0x29), iVar8 == 0))
    goto LAB_0037672f;
    bVar16 = bVar3 != 0x5c;
    bVar12 = bVar3 == 0x20;
    if (!bVar16) {
      bVar12 = bVar16;
    }
    if (bVar17) {
      bVar12 = bVar16;
    }
    bVar17 = bVar12;
    bVar3 = pbVar15[1];
    pbVar15 = pbVar15 + 1;
  } while (bVar3 != 0);
  pbVar15 = (byte *)0x0;
LAB_0037672f:
  if (pbVar15 == (byte *)0x0) {
    Wlc_PrsWriteErrorMessage(p,(char *)pbVar14,"Expecting closing parenthesis.");
  }
  else {
    *pbVar15 = 0x20;
    *pbVar14 = 0x20;
    do {
      pbVar14 = pbVar10 + 1;
      pbVar13 = pbVar10 + 1;
      pbVar10 = pbVar14;
    } while (*pbVar13 == 0x20);
  }
  iVar8 = 0;
  if (pbVar15 == (byte *)0x0) {
    return 0;
  }
  goto LAB_0037682e;
  while( true ) {
    bVar16 = bVar7 != 0x5c;
    bVar12 = bVar7 == 0x20;
    if (!bVar16) {
      bVar12 = bVar16;
    }
    if (bVar17) {
      bVar12 = bVar16;
    }
    bVar17 = bVar12;
    bVar7 = *pbVar10;
    pbVar10 = pbVar10 + 1;
    if (bVar7 == 0) break;
LAB_00376d26:
    if ((bool)(bVar17 & bVar7 == 0x27)) {
      iVar11 = 0x18;
      break;
    }
  }
LAB_00376ee6:
  if (bVar3 != 0) {
    bVar17 = true;
    do {
      pbVar10 = pbVar14 + 1;
      if ((bool)(bVar17 & bVar3 == 0x2c)) goto LAB_00376f1b;
      bVar16 = bVar3 != 0x5c;
      bVar12 = bVar3 == 0x20;
      if (!bVar16) {
        bVar12 = bVar16;
      }
      if (bVar17) {
        bVar12 = bVar16;
      }
      bVar17 = bVar12;
      bVar3 = pbVar14[2];
      pbVar14 = pbVar10;
    } while (bVar3 != 0);
  }
  pbVar10 = (byte *)0x0;
LAB_00376f1b:
  if (pbVar10 == (byte *)0x0) {
    pcVar5 = "Expecting one comma in this line.";
    goto LAB_00376cef;
  }
  pcVar5 = Wlc_PrsReadName(p,(char *)(pbVar10 + 1),vFanins);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "Cannot read name in sign-extension.";
    goto LAB_00376cef;
  }
  pbVar14 = (byte *)(pcVar5 + -1);
  do {
    pbVar10 = pbVar14 + 1;
    pbVar14 = pbVar14 + 1;
  } while (*pbVar10 == 0x20);
  if (*pbVar10 != 0x7d) {
    pcVar5 = "There is no closing brace (}).";
    goto LAB_00376cf7;
  }
  goto LAB_00376f4b;
}

Assistant:

static inline int Wlc_PrsFindDefinition( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pXValue )
{
    char * pName;
    int Type = WLC_OBJ_NONE;
    int fRotating = 0;
    Vec_IntClear( vFanins );
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '=' )
        return 0;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( pStr[0] == '(' )
    {
        // consider rotating shifter
        if ( Wlc_PrsFindSymbolTwo(pStr, '>', '>') && Wlc_PrsFindSymbolTwo(pStr, '<', '<') )
        {
            // THIS IS A HACK TO DETECT rotating shifters
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = ' '; *pClose = 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            fRotating = 1;
        }
        else
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
            pStr = Wlc_PrsSkipSpaces( pStr );
        }
    }
    if ( Wlc_PrsIsDigit(pStr) )
    {
        int Range, Signed;
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, pXValue );
        if ( pStr == NULL )
            return 0;
        Type = WLC_OBJ_CONST;
    }
    else if ( pStr[0] == '!' || (pStr[0] == '~' && pStr[1] != '&' && pStr[1] != '|' && pStr[1] != '^') || pStr[0] == '@' || pStr[0] == '#' )
    {
        if ( pStr[0] == '!' )
            Type = WLC_OBJ_LOGIC_NOT;
        else if ( pStr[0] == '~' )
            Type = WLC_OBJ_BIT_NOT;
        else if ( pStr[0] == '@' )
            Type = WLC_OBJ_ARI_SQRT;
        else if ( pStr[0] == '#' )
            Type = WLC_OBJ_ARI_SQUARE;
        else assert( 0 );
        // skip parentheses
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( pStr[0] == '(' )
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
        }
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after !." );
    }
    else if ( pStr[0] == '-' || 
              pStr[0] == '&' || pStr[0] == '|' || pStr[0] == '^' || 
              (pStr[0] == '~' && pStr[1] == '&') || 
              (pStr[0] == '~' && pStr[1] == '|') || 
              (pStr[0] == '~' && pStr[1] == '^') )
    {
        int shift = 1;
        if ( pStr[0] == '-' )
            Type = WLC_OBJ_ARI_MINUS;
        else if ( pStr[0] == '&' )
            Type = WLC_OBJ_REDUCT_AND;
        else if ( pStr[0] == '|' )
            Type = WLC_OBJ_REDUCT_OR;
        else if ( pStr[0] == '^' )
            Type = WLC_OBJ_REDUCT_XOR;
        else if ( pStr[0] == '~' && pStr[1] == '&' )
            {Type = WLC_OBJ_REDUCT_NAND; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '|' )
            {Type = WLC_OBJ_REDUCT_NOR; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '^' )
            {Type = WLC_OBJ_REDUCT_NXOR; shift = 2;}
        else assert( 0 );
        if ( !(pStr = Wlc_PrsReadName(p, pStr+shift, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after a unary operator." );
    }
    else if ( pStr[0] == '{' )
    {
        // THIS IS A HACK TO DETECT zero padding AND sign extension
        if ( Wlc_PrsFindSymbol(pStr+1, '{') )
        {
            if ( Wlc_PrsFindSymbol(pStr+1, '\'') )
                Type = WLC_OBJ_BIT_ZEROPAD;
            else
                Type = WLC_OBJ_BIT_SIGNEXT;
            pStr = Wlc_PrsFindSymbol(pStr+1, ',');
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting one comma in this line." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in sign-extension." );
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( pStr[0] != '}' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "There is no closing brace (})." );
        }
        else // concatenation
        {
            while ( 1 )
            {
                pStr = Wlc_PrsSkipSpaces( pStr+1 );
                if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in concatenation." );
                if ( pStr[0] == '}' )
                    break;
                if ( pStr[0] != ',' )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Expected comma (,) in this place." );
            }
            Type = WLC_OBJ_BIT_CONCAT;
        }
        assert( pStr[0] == '}' );
        pStr++;
    }
    else
    {
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return 0;
        // get the next symbol
        if ( pStr[0] == 0 )
            Type = WLC_OBJ_BUF;
        else if ( pStr[0] == '?' )
        {
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            if ( pStr[0] != ':' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "MUX lacks the colon symbol (:)." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            assert( Vec_IntSize(vFanins) == 3 );
            ABC_SWAP( int, Vec_IntArray(vFanins)[1], Vec_IntArray(vFanins)[2] );
            Type = WLC_OBJ_MUX;
        }
        else if ( pStr[0] == '[' )
        {
            int End, Beg; char * pLine = pStr;
            pStr = Wlc_PrsFindRange( pStr, &End, &Beg );
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
            Vec_IntPushTwo( vFanins, End, Beg );
            Type = WLC_OBJ_BIT_SELECT;
        }
        else 
        {
                 if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] != '>' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_R : WLC_OBJ_SHIFT_R;
            else if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] == '>' ) pStr += 3, Type = WLC_OBJ_SHIFT_RA;      
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] != '<' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_L : WLC_OBJ_SHIFT_L;
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] == '<' ) pStr += 3, Type = WLC_OBJ_SHIFT_LA;      
            else if ( pStr[0] == '&' && pStr[1] != '&'                   ) pStr += 1, Type = WLC_OBJ_BIT_AND;       
            else if ( pStr[0] == '|' && pStr[1] != '|'                   ) pStr += 1, Type = WLC_OBJ_BIT_OR;        
            else if ( pStr[0] == '^' && pStr[1] != '^'                   ) pStr += 1, Type = WLC_OBJ_BIT_XOR;       
            else if ( pStr[0] == '~' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_BIT_NAND;       
            else if ( pStr[0] == '~' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_BIT_NOR;       
            else if ( pStr[0] == '~' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_BIT_NXOR;       
            else if ( pStr[0] == '=' && pStr[1] == '>'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_IMPL;     
            else if ( pStr[0] == '&' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_AND;     
            else if ( pStr[0] == '|' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_OR;      
            else if ( pStr[0] == '^' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_XOR;      
            else if ( pStr[0] == '=' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_EQU;      
            else if ( pStr[0] == '!' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_NOTEQU;      
            else if ( pStr[0] == '<' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_LESS;     
            else if ( pStr[0] == '>' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_MORE;     
            else if ( pStr[0] == '<' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_LESSEQU;
            else if ( pStr[0] == '>' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_MOREEQU;  
            else if ( pStr[0] == '+'                                     ) pStr += 1, Type = WLC_OBJ_ARI_ADD;       
            else if ( pStr[0] == '-'                                     ) pStr += 1, Type = WLC_OBJ_ARI_SUB;       
            else if ( pStr[0] == '*' && pStr[1] != '*'                   ) pStr += 1, Type = WLC_OBJ_ARI_MULTI;     
            else if ( pStr[0] == '/'                                     ) pStr += 1, Type = WLC_OBJ_ARI_DIVIDE;        
            else if ( pStr[0] == '%'                                     ) pStr += 1, Type = WLC_OBJ_ARI_REM;   
            else if ( pStr[0] == '*' && pStr[1] == '*'                   ) pStr += 2, Type = WLC_OBJ_ARI_POWER;
            else return Wlc_PrsWriteErrorMessage( p, pStr, "Unsupported operation (%c).", pStr[0] );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( Type == WLC_OBJ_ARI_ADD && pStr[0] == '+' )
            {
                if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                    return 0;
                pStr = Wlc_PrsSkipSpaces( pStr );
            }
            if ( pStr[0] )
                printf( "Warning: Trailing symbols \"%s\" in line %d.\n", pStr, Wlc_PrsFindLine(p, pStr) );
        }
    }
    // make sure there is nothing left there
    if ( pStr )
    {
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr != NULL )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is left at the end of the line.", pName );   
    }
    return Type;
}